

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O2

string * __thiscall
cpsm::str_join<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (string *__return_storage_ptr__,cpsm *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *xs,string_ref sep)

{
  long lVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  unsigned_long *x;
  long lVar3;
  stringstream ss;
  basic_string_ref<char,_std::char_traits<char>_> local_1c8;
  stringstream local_1b8 [16];
  basic_ostream<char,_std::char_traits<char>_> local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1c8.ptr_ = (char *)0x0;
  local_1c8.len_ = 0;
  lVar1 = *(long *)(this + 8);
  for (lVar3 = *(long *)this; lVar3 != lVar1; lVar3 = lVar3 + 8) {
    pbVar2 = boost::operator<<(local_1a8,&local_1c8);
    std::ostream::_M_insert<unsigned_long>((ulong)pbVar2);
    local_1c8.ptr_ = (char *)xs;
    local_1c8.len_ = (size_t)sep.ptr_;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string str_join(T const& xs, boost::string_ref const sep) {
  std::stringstream ss;
  boost::string_ref s;
  for (auto const& x : xs) {
    ss << s << x;
    s = sep;
  }
  return ss.str();
}